

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::ComputeAofs
          (NavierStokesBase *this,int comp,int ncomp,MultiFab *S,int S_comp,MultiFab *forcing_term,
          MultiFab *divu,bool is_velocity,Real dt)

{
  DistributionMapping *pDVar1;
  string redistribution_type;
  string redistribution_type_00;
  pointer pAVar2;
  bool bVar3;
  int iVar4;
  BoxArray *pBVar5;
  long *plVar6;
  NavierStokesBase *pNVar7;
  long lVar8;
  MultiFab *pMVar9;
  MultiFab *pMVar10;
  ulong uVar11;
  long *plVar12;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs;
  int d;
  int d_1;
  uint ncomp_00;
  BCRec *pBVar13;
  undefined4 in_stack_fffffffffffff5d8;
  Real local_9f8;
  Vector<int,_std::allocator<int>_> iconserv_h;
  DeviceVector<int> iconserv;
  undefined8 local_9a8;
  undefined8 local_9a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_998;
  MultiFab *local_980;
  long *local_978 [2];
  long local_968 [2];
  long *local_958 [2];
  long local_948 [2];
  MultiFab local_938 [6];
  
  iconserv.m_data = (pointer)0x0;
  iconserv.m_size = 0;
  iconserv.m_capacity = 0;
  iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  amrex::PODVector<int,_std::allocator<int>_>::resize(&iconserv,(long)ncomp);
  if ((ncomp != 0) && (iconserv.m_size != 0)) {
    memset(iconserv.m_data,0,iconserv.m_size << 2);
  }
  pMVar10 = local_938;
  local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&iconserv_h.super_vector<int,_std::allocator<int>_>,(long)ncomp,
             (value_type_conflict *)pMVar10);
  pAVar2 = advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
           super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < ncomp) {
    uVar11 = 0;
    do {
      iconserv_h.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar11]
           = (uint)(pAVar2[(long)comp + uVar11] == Conservative);
      uVar11 = uVar11 + 1;
    } while ((uint)ncomp != uVar11);
  }
  if ((long)iconserv_h.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      - (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 0) {
    memcpy(iconserv.m_data,
           iconserv_h.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
           (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start);
  }
  lVar8 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + 0x180;
  } while (lVar8 != 0x480);
  lVar8 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + 0x180;
  } while (lVar8 != 0x480);
  pDVar1 = &(this->super_AmrLevel).dmap;
  pMVar9 = local_938 + 3;
  lVar8 = 0;
  do {
    pBVar5 = amrex::AmrLevel::getEdgeBoxArray(&this->super_AmrLevel,(int)lVar8);
    local_9a8 = 1;
    vStack_998.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_998.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9a0 = 0;
    vStack_998.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ncomp_00 = ncomp;
    (*(pMVar10->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar10,pBVar5,pDVar1,(ulong)(uint)ncomp,0,&local_9a8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_998);
    local_9a8 = 1;
    vStack_998.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_998.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9a0 = 0;
    vStack_998.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (*(pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar9,pBVar5,pDVar1,(ulong)(uint)ncomp,0,&local_9a8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_998);
    lVar8 = lVar8 + 1;
    pMVar9 = pMVar9 + 1;
    pMVar10 = pMVar10 + 1;
    ncomp = ncomp_00;
  } while (lVar8 != 3);
  bcs = &this->m_bcrec_scalars;
  if (is_velocity) {
    bcs = &this->m_bcrec_velocity;
  }
  lVar8 = 0xbe0;
  if (is_velocity) {
    lVar8 = 0xbc8;
  }
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  if (iVar4 == 0 && !is_velocity) {
    pMVar10 = this->u_mac;
    BDS::ComputeAofs(this->aofs,comp,ncomp_00,S,S_comp,pMVar10,pMVar10 + 1,pMVar10 + 2,local_938 + 3
                     ,local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                     forcing_term,0,divu,
                     *(BCRec **)
                      ((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18),
                     &(this->super_AmrLevel).geom,&iconserv_h,dt,false);
    goto LAB_0025af48;
  }
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  if (iVar4 == 0) {
LAB_0025ab08:
    bVar3 = amrex::EBFArrayBoxFactory::isAllRegular
                      ((EBFArrayBoxFactory *)
                       (this->super_AmrLevel).m_factory._M_t.
                       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                       _M_head_impl);
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
      pMVar10 = this->u_mac;
      Godunov::ComputeAofs
                (this->aofs,comp,ncomp_00,S,S_comp,pMVar10,pMVar10 + 1,pMVar10 + 2,local_938 + 3,
                 local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                 forcing_term,0,divu,
                 *(BCRec **)
                  ((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18),
                 &(this->super_AmrLevel).geom,&iconserv_h,dt,iVar4 == 0,godunov_use_forces_in_trans,
                 is_velocity);
      goto LAB_0025af48;
    }
    pMVar10 = this->u_mac;
    pMVar9 = this->aofs;
    pBVar13 = *(BCRec **)((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18);
    local_958[0] = local_948;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_958,redistribution_type_abi_cxx11_._M_dataplus._M_p,
               redistribution_type_abi_cxx11_._M_dataplus._M_p +
               redistribution_type_abi_cxx11_._M_string_length);
    local_980 = local_938 + 1;
    redistribution_type._M_string_length._0_4_ = ncomp_00;
    redistribution_type._M_dataplus._M_p = (pointer)local_958;
    redistribution_type._M_string_length._4_4_ = comp;
    redistribution_type.field_2._M_allocated_capacity = (size_type)pBVar13;
    redistribution_type.field_2._8_4_ = in_stack_fffffffffffff5d8;
    redistribution_type.field_2._12_4_ = S_comp;
    EBGodunov::ComputeAofs
              (pMVar9,comp,ncomp_00,S,S_comp,pMVar10,pMVar10 + 1,pMVar10 + 2,local_938 + 3,
               local_938 + 4,local_938 + 5,0,false,local_938,local_980,local_938 + 2,0,forcing_term,
               0,divu,bcs,pBVar13,&(this->super_AmrLevel).geom,&iconserv_h,dt,is_velocity,
               redistribution_type);
    plVar6 = local_948;
    plVar12 = local_958[0];
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    if (iVar4 == 0) goto LAB_0025ab08;
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    if (is_velocity && iVar4 == 0) goto LAB_0025ab08;
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    if (iVar4 != 0) {
      amrex::Abort_host("NSB::ComputeAofs: Unknown advection_scheme");
      goto LAB_0025af48;
    }
    bVar3 = amrex::EBFArrayBoxFactory::isAllRegular
                      ((EBFArrayBoxFactory *)
                       (this->super_AmrLevel).m_factory._M_t.
                       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                       _M_head_impl);
    pMVar10 = this->u_mac;
    pMVar9 = this->aofs;
    if (bVar3) {
      MOL::ComputeAofs(pMVar9,comp,ncomp_00,S,S_comp,pMVar10,pMVar10 + 1,pMVar10 + 2,local_938 + 3,
                       local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                       divu,bcs,*(BCRec **)
                                 ((long)(this->super_AmrLevel).geom.super_CoordSys.offset +
                                 lVar8 + -0x18),&iconserv,&(this->super_AmrLevel).geom,is_velocity);
      goto LAB_0025af48;
    }
    pBVar13 = *(BCRec **)((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18);
    local_978[0] = local_968;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_978,redistribution_type_abi_cxx11_._M_dataplus._M_p,
               redistribution_type_abi_cxx11_._M_dataplus._M_p +
               redistribution_type_abi_cxx11_._M_string_length);
    redistribution_type_00._M_string_length._0_4_ = ncomp_00;
    redistribution_type_00._M_dataplus._M_p = (pointer)local_978;
    redistribution_type_00._M_string_length._4_4_ = comp;
    redistribution_type_00.field_2._M_allocated_capacity = (size_type)pBVar13;
    redistribution_type_00.field_2._8_4_ = in_stack_fffffffffffff5d8;
    redistribution_type_00.field_2._12_4_ = S_comp;
    EBMOL::ComputeAofs(pMVar9,comp,ncomp_00,S,S_comp,pMVar10,pMVar10 + 1,pMVar10 + 2,local_938 + 3,
                       local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                       divu,bcs,pBVar13,&iconserv,&(this->super_AmrLevel).geom,dt,is_velocity,
                       redistribution_type_00);
    plVar6 = local_968;
    plVar12 = local_978[0];
  }
  if (plVar12 != plVar6) {
    operator_delete(plVar12,*plVar6 + 1);
  }
LAB_0025af48:
  if (do_reflux != 0) {
    iVar4 = (this->super_AmrLevel).level;
    if (0 < iVar4) {
      pMVar10 = local_938;
      lVar8 = 0;
      do {
        amrex::FluxRegister::FineAdd(this->advflux_reg,pMVar10,(int)lVar8,0,comp,ncomp_00,dt);
        lVar8 = lVar8 + 1;
        pMVar10 = pMVar10 + 1;
      } while (lVar8 != 3);
      iVar4 = (this->super_AmrLevel).level;
    }
    if (iVar4 < *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.
                         super_AmrInfo.field_0x8c) {
      local_9f8 = -dt;
      pMVar10 = local_938;
      lVar8 = 0;
      do {
        pNVar7 = getLevel(this,(this->super_AmrLevel).level + 1);
        amrex::FluxRegister::CrseInit
                  (pNVar7->advflux_reg,pMVar10,(int)lVar8,0,comp,ncomp_00,local_9f8,COPY);
        lVar8 = lVar8 + 1;
        pMVar10 = pMVar10 + 1;
      } while (lVar8 != 3);
    }
  }
  lVar8 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + -0x180;
  } while (lVar8 != -0x180);
  lVar8 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + -0x180;
  } while (lVar8 != -0x180);
  if (iconserv_h.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(iconserv_h.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (iconserv.m_data != (pointer)0x0) {
    operator_delete(iconserv.m_data,iconserv.m_capacity << 2);
  }
  return;
}

Assistant:

void
NavierStokesBase::ComputeAofs ( int comp, int ncomp,
                                MultiFab const& S,
                                int S_comp,
                                MultiFab const& forcing_term,
                                MultiFab const& divu,
                                bool is_velocity, Real dt )
{

    // Advection type conservative or non?
    amrex::Gpu::DeviceVector<int> iconserv;
    Vector<int> iconserv_h;
    iconserv.resize(ncomp, 0);
    iconserv_h.resize(ncomp, 0);
    for (int i = 0; i < ncomp; ++i) {
        iconserv_h[i] = (advectionType[comp+i] == Conservative) ? 1 : 0;
    }
    Gpu::copy(Gpu::hostToDevice,iconserv_h.begin(),iconserv_h.end(), iconserv.begin());

    MultiFab cfluxes[AMREX_SPACEDIM];
    MultiFab edgestate[AMREX_SPACEDIM];

    //
    // Advection needs S to have 2-3 ghost cells.
    // Advection routines call slopes on cells i & i+1, and then
    // 2nd order slopes use i+/-1 => S needs 2 ghost cells (MOL)
    // 4th order slopes use i+/-2 => S needs 3 ghost cells (Godunov)
    //
    int nghost = 0;
    for (int i = 0; i < AMREX_SPACEDIM; ++i)
    {
        const BoxArray& ba = getEdgeBoxArray(i);
        cfluxes[i].define(ba, dmap, ncomp, nghost, MFInfo(), Factory());
        edgestate[i].define(ba, dmap, ncomp, nghost, MFInfo(), Factory());
    }

    auto const& bcrec_h = is_velocity? m_bcrec_velocity   : m_bcrec_scalars;
    auto const& bcrec_d = is_velocity? m_bcrec_velocity_d : m_bcrec_scalars_d;

    //
    // >>>>>>>>>>>>>>>>>>>>>>>>>>>  BDS ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
    //
    if (advection_scheme == "BDS" && (!is_velocity))
    {
        BDS::ComputeAofs(*aofs, comp, ncomp,
                         S, S_comp,
                         AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                         AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                         0, false,
                         AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]),
                         0, forcing_term, 0, divu, bcrec_d.dataPtr(),
                         geom, iconserv_h, dt, is_velocity);
    }
    else if (advection_scheme == "Godunov_PLM" || advection_scheme == "Godunov_PPM" || (advection_scheme == "BDS" && is_velocity) )
    {
        //
        // >>>>>>>>>>>>>>>>>>>>>>>>>>>  Godunov ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
        //
#ifdef AMREX_USE_EB
        if (!EBFactory().isAllRegular())
        {
            EBGodunov::ComputeAofs(*aofs, comp, ncomp,
                                    S, S_comp,
                                    AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                    AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                                    0, false,
                                    AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                                    forcing_term, 0, divu,
                                    bcrec_h, bcrec_d.dataPtr(),
                                    geom, iconserv_h, dt, is_velocity, redistribution_type);
        }
        else
#endif
        {
            bool godunov_use_ppm = ( advection_scheme == "Godunov_PPM" ? true : false );

            Godunov::ComputeAofs(*aofs, comp, ncomp,
                                 S, S_comp,
                                 AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                 AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                                 0, false,
                                 AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]),
                                 0, forcing_term, 0, divu, bcrec_d.dataPtr(),
                                 geom, iconserv_h, dt,
                                 godunov_use_ppm, godunov_use_forces_in_trans, is_velocity);
        }
    }
    else if ( advection_scheme == "MOL" )
    {
        
        //
        // >>>>>>>>>>>>>>>>>>>>>>>>>>>  MOL ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
        //
#ifdef AMREX_USE_EB
        if (!EBFactory().isAllRegular())
        {
            EBMOL::ComputeAofs(*aofs, comp, ncomp,
                               S, S_comp,
                               D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                               D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                               D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                               divu,
                               bcrec_h, bcrec_d.dataPtr(), iconserv,
                               geom, dt, is_velocity, redistribution_type );
        }
        else
#endif
        {
            MOL::ComputeAofs(*aofs, comp, ncomp,
                             S, S_comp,
                             D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                             D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                             D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                             divu,
                             bcrec_h, bcrec_d.dataPtr(), iconserv,
                             geom, is_velocity );
        }
    }
    else
    {
        Abort("NSB::ComputeAofs: Unknown advection_scheme");
    }

    if (do_reflux)
    {
        if (level > 0 )
        {
            for (int d = 0; d < AMREX_SPACEDIM; d++) {
                advflux_reg->FineAdd(cfluxes[d],d,0,comp,ncomp,dt);
            }
        }

        if (level < parent->finestLevel())
        {
            for (int d = 0; d < AMREX_SPACEDIM; d++) {
                getAdvFluxReg(level+1).CrseInit(cfluxes[d],d,0,comp,ncomp,-dt);
            }
        }
    }

}